

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

bool __thiscall S2Polyline::NearlyCovers(S2Polyline *this,S2Polyline *covered,S1Angle max_error)

{
  pointer pSVar1;
  double *pdVar2;
  _Rb_tree_color _Var3;
  double dVar4;
  uchar uVar5;
  _Rb_tree_color k;
  int iVar6;
  long lVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  S2Polyline *pSVar10;
  bool bVar11;
  double *ap;
  S2Point *pSVar12;
  S2Point *pSVar13;
  S2Point *b;
  _Rb_tree_node_base *p_Var14;
  _Link_type __x;
  long lVar15;
  uint k_00;
  uint uVar16;
  _Base_ptr p_Var17;
  _Link_type p_Var18;
  uint uVar19;
  int iVar20;
  _Rb_tree_node_base *p_Var21;
  bool bVar22;
  bool bVar23;
  S2Point j_begin;
  S2Point closest_point;
  vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
  pending;
  set<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
  done;
  undefined1 local_f0 [8];
  bool bStack_e8;
  undefined7 uStack_e7;
  _Base_ptr local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
  local_98;
  S1Angle local_78;
  S2Polyline *local_70;
  S1Angle local_68 [2];
  _Rb_tree_node_base local_58;
  long local_38;
  
  if (covered->num_vertices_ == 0) {
    bVar22 = true;
  }
  else if (this->num_vertices_ == 0) {
    bVar22 = false;
  }
  else {
    local_98.
    super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58._M_left = &local_58;
    local_58._M_color = _S_red;
    local_58._M_parent = (_Rb_tree_node_base *)0x0;
    local_38 = 0;
    __x = (_Link_type)0x0;
    local_78.radians_ = max_error.radians_;
    local_58._M_right = local_58._M_left;
    pSVar12 = vertex(this,0);
    uVar16 = 1;
    if (1 < this->num_vertices_) {
      while( true ) {
        __x = (_Link_type)(ulong)uVar16;
        pSVar13 = vertex(this,uVar16);
        if ((pSVar13->c_[0] != pSVar12->c_[0]) || (NAN(pSVar13->c_[0]) || NAN(pSVar12->c_[0])))
        break;
        lVar15 = 0;
        while (lVar15 != 0x10) {
          dVar4 = *(double *)((long)pSVar13->c_ + lVar15 + 8);
          pdVar2 = (double *)((long)pSVar12->c_ + lVar15 + 8);
          lVar15 = lVar15 + 8;
          if ((dVar4 != *pdVar2) || (NAN(dVar4) || NAN(*pdVar2))) goto LAB_00213eb8;
        }
        uVar16 = uVar16 + 1;
        if (this->num_vertices_ <= (int)uVar16) break;
      }
    }
LAB_00213eb8:
    if ((int)uVar16 < this->num_vertices_) {
      uVar19 = 0;
      do {
        k_00 = uVar16;
        pSVar12 = vertex(this,k_00);
        uVar16 = k_00;
        while (uVar16 = uVar16 + 1, (int)uVar16 < this->num_vertices_) {
          pSVar13 = vertex(this,uVar16);
          if ((pSVar13->c_[0] != pSVar12->c_[0]) || (NAN(pSVar13->c_[0]) || NAN(pSVar12->c_[0])))
          break;
          lVar15 = 0;
          while (lVar15 != 0x10) {
            dVar4 = *(double *)((long)pSVar13->c_ + lVar15 + 8);
            pdVar2 = (double *)((long)pSVar12->c_ + lVar15 + 8);
            lVar15 = lVar15 + 8;
            if ((dVar4 != *pdVar2) || (NAN(dVar4) || NAN(*pdVar2))) goto LAB_00213f1b;
          }
        }
LAB_00213f1b:
        pSVar12 = vertex(covered,0);
        pSVar13 = vertex(this,uVar19);
        b = vertex(this,k_00);
        S2::Project((S2Point *)local_b8,pSVar12,pSVar13,b);
        if (uVar16 != this->num_vertices_) {
          __x = (_Link_type)(ulong)k_00;
          pSVar12 = vertex(this,k_00);
          if (((double)local_b8._0_8_ == pSVar12->c_[0]) &&
             (!NAN((double)local_b8._0_8_) && !NAN(pSVar12->c_[0]))) {
            lVar15 = 0;
            do {
              if (lVar15 == 0x10) goto LAB_00213ff0;
              lVar7 = lVar15 + 8;
              pdVar2 = (double *)((long)pSVar12->c_ + lVar15 + 8);
              lVar15 = lVar15 + 8;
            } while ((*(double *)(local_b8 + lVar7) == *pdVar2) &&
                    (!NAN(*(double *)(local_b8 + lVar7)) && !NAN(*pdVar2)));
          }
        }
        pSVar12 = vertex(covered,0);
        __x = (_Link_type)local_b8;
        S1Angle::S1Angle(local_68,(S2Point *)__x,pSVar12);
        if (local_68[0].radians_ <= local_78.radians_) {
          local_d8._4_4_ = 0;
          local_d8._0_4_ = uVar19;
          local_d8[8] = 1;
          __x = (_Link_type)local_d8;
          std::
          vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
          ::push_back(&local_98,(value_type *)__x);
        }
LAB_00213ff0:
        uVar19 = k_00;
      } while ((int)uVar16 < this->num_vertices_);
    }
    bVar22 = local_98.
             super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_98.
             super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pSVar10 = covered;
    if (bVar22) {
      do {
        local_70 = pSVar10;
        pSVar1 = local_98.
                 super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        k = local_98.
            super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].i;
        uVar16 = local_98.
                 super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].j;
        bVar11 = local_98.
                 super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].i_in_progress;
        uVar5 = local_98.
                super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].field_0xb;
        uVar8 = local_98.
                super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].field_0x9;
        uVar9 = local_98.
                super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].field_0xa;
        p_Var17 = local_58._M_parent;
        if (local_58._M_parent == (_Rb_tree_node_base *)0x0) {
          bVar23 = true;
          p_Var21 = &local_58;
        }
        else {
          do {
            p_Var21 = p_Var17;
            _Var3 = p_Var21[1]._M_color;
            bVar23 = SBORROW4(k,_Var3);
            iVar20 = k - _Var3;
            if (k == _Var3) {
              uVar19 = *(uint *)&p_Var21[1].field_0x4;
              bVar23 = SBORROW4(uVar16,uVar19);
              iVar20 = uVar16 - uVar19;
              if (uVar16 != uVar19) goto LAB_00214066;
              bVar23 = bVar11 < *(byte *)&p_Var21[1]._M_parent;
            }
            else {
LAB_00214066:
              bVar23 = bVar23 != iVar20 < 0;
            }
            p_Var17 = (&p_Var21->_M_left)[bVar23 ^ 1];
          } while (p_Var17 != (_Base_ptr)0x0);
        }
        p_Var14 = p_Var21;
        local_98.
        super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
        if (bVar23 == false) {
LAB_0021409f:
          _Var3 = p_Var14[1]._M_color;
          bVar23 = SBORROW4(_Var3,k);
          iVar20 = _Var3 - k;
          if (_Var3 == k) {
            uVar19 = *(uint *)&p_Var14[1].field_0x4;
            bVar23 = SBORROW4(uVar19,uVar16);
            iVar20 = uVar19 - uVar16;
            if (uVar19 != uVar16) goto LAB_002140b4;
            bVar23 = *(byte *)&p_Var14[1]._M_parent < bVar11;
          }
          else {
LAB_002140b4:
            bVar23 = bVar23 != iVar20 < 0;
          }
          if (!bVar23) {
            p_Var21 = (_Rb_tree_node_base *)0x0;
            p_Var17 = p_Var14;
          }
        }
        else if (p_Var21 != local_58._M_left) {
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var21);
          goto LAB_0021409f;
        }
        iVar20 = 5;
        if (p_Var21 != (_Rb_tree_node_base *)0x0) {
          bVar23 = true;
          if ((p_Var17 == (_Rb_tree_node_base *)0x0) && (&local_58 != p_Var21)) {
            _Var3 = p_Var21[1]._M_color;
            bVar23 = SBORROW4(k,_Var3);
            iVar6 = k - _Var3;
            if (k == _Var3) {
              uVar19 = *(uint *)&p_Var21[1].field_0x4;
              bVar23 = SBORROW4(uVar16,uVar19);
              iVar6 = uVar16 - uVar19;
              if (uVar16 == uVar19) {
                bVar23 = bVar11 < *(byte *)&p_Var21[1]._M_parent;
                goto LAB_0021410c;
              }
            }
            bVar23 = bVar23 != iVar6 < 0;
          }
LAB_0021410c:
          __x = (_Link_type)operator_new(0x30);
          *(_Rb_tree_color *)(__x->_M_storage)._M_storage = k;
          *(uint *)((__x->_M_storage)._M_storage + 4) = uVar16;
          (__x->_M_storage)._M_storage[8] = bVar11;
          (__x->_M_storage)._M_storage[9] = uVar8;
          (__x->_M_storage)._M_storage[10] = uVar9;
          (__x->_M_storage)._M_storage[0xb] = uVar5;
          std::_Rb_tree_insert_and_rebalance(bVar23,(_Rb_tree_node_base *)__x,p_Var21,&local_58);
          local_38 = local_38 + 1;
          if (p_Var21 != (_Rb_tree_node_base *)0x0) {
            pSVar12 = vertex(this,k);
            pSVar10 = local_70;
            _Var3 = k;
            while (_Var3 = _Var3 + _S_black, (int)_Var3 < this->num_vertices_) {
              pSVar13 = vertex(this,_Var3);
              if ((pSVar13->c_[0] != pSVar12->c_[0]) || (NAN(pSVar13->c_[0]) || NAN(pSVar12->c_[0]))
                 ) break;
              lVar15 = 0;
              while (lVar15 != 0x10) {
                dVar4 = *(double *)((long)pSVar13->c_ + lVar15 + 8);
                pdVar2 = (double *)((long)pSVar12->c_ + lVar15 + 8);
                lVar15 = lVar15 + 8;
                if ((dVar4 != *pdVar2) || (NAN(dVar4) || NAN(*pdVar2))) goto LAB_002141c4;
              }
            }
LAB_002141c4:
            __x = (_Link_type)(ulong)uVar16;
            pSVar12 = vertex(pSVar10,uVar16);
            uVar19 = uVar16;
            while( true ) {
              uVar19 = uVar19 + 1;
              p_Var18 = (_Link_type)(ulong)uVar19;
              if (pSVar10->num_vertices_ <= (int)uVar19) break;
              pSVar13 = vertex(pSVar10,uVar19);
              __x = p_Var18;
              if ((pSVar13->c_[0] != pSVar12->c_[0]) || (NAN(pSVar13->c_[0]) || NAN(pSVar12->c_[0]))
                 ) break;
              lVar15 = 0;
              while (lVar15 != 0x10) {
                dVar4 = *(double *)((long)pSVar13->c_ + lVar15 + 8);
                pdVar2 = (double *)((long)pSVar12->c_ + lVar15 + 8);
                lVar15 = lVar15 + 8;
                if ((dVar4 != *pdVar2) || (NAN(dVar4) || NAN(*pdVar2))) goto LAB_00214216;
              }
            }
LAB_00214216:
            iVar20 = 1;
            if ((uVar19 != pSVar10->num_vertices_) && (iVar20 = 5, _Var3 != this->num_vertices_)) {
              local_b8._0_8_ = 0.0;
              local_b8._8_8_ = (_Base_ptr)0x0;
              local_b8._16_8_ = (_Base_ptr)0x0;
              local_d8._16_8_ = (_Base_ptr)0x0;
              local_d8._0_8_ = (_Base_ptr)0x0;
              local_d8._8_8_ = (_Base_ptr)0x0;
              if ((bVar11 & 1U) == 0) {
                pSVar12 = vertex(this,k);
                local_b8._16_8_ = pSVar12->c_[2];
                local_b8._0_8_ = pSVar12->c_[0];
                local_b8._8_8_ = pSVar12->c_[1];
                pSVar12 = vertex(pSVar10,uVar16);
                pSVar13 = vertex(pSVar10,uVar19);
                S2::Project((S2Point *)local_f0,(S2Point *)local_b8,pSVar12,pSVar13);
                local_d8._16_8_ = local_e0;
                local_d8._0_8_ = CONCAT44(local_f0._4_4_,local_f0._0_4_);
                local_d8._8_8_ = CONCAT71(uStack_e7,bStack_e8);
              }
              else {
                pSVar12 = vertex(pSVar10,uVar16);
                local_d8._16_8_ = pSVar12->c_[2];
                local_d8._0_8_ = pSVar12->c_[0];
                local_d8._8_8_ = pSVar12->c_[1];
                pSVar12 = vertex(this,k);
                pSVar13 = vertex(this,_Var3);
                S2::Project((S2Point *)local_f0,(S2Point *)local_d8,pSVar12,pSVar13);
                local_b8._16_8_ = local_e0;
                local_b8._0_8_ = CONCAT44(local_f0._4_4_,local_f0._0_4_);
                local_b8._8_8_ = CONCAT71(uStack_e7,bStack_e8);
              }
              pSVar12 = vertex(pSVar10,uVar19);
              pSVar13 = vertex(this,_Var3);
              bVar11 = S2::IsEdgeBNearEdgeA
                                 ((S2Point *)local_d8,pSVar12,(S2Point *)local_b8,pSVar13,local_78);
              if (bVar11) {
                bStack_e8 = false;
                local_f0._0_4_ = _Var3;
                local_f0._4_4_ = uVar16;
                std::
                vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                ::push_back(&local_98,(value_type *)local_f0);
              }
              __x = (_Link_type)vertex(this,_Var3);
              pSVar12 = vertex(pSVar10,uVar19);
              bVar11 = S2::IsEdgeBNearEdgeA
                                 ((S2Point *)local_b8,(S2Point *)__x,(S2Point *)local_d8,pSVar12,
                                  local_78);
              if (bVar11) {
                bStack_e8 = true;
                __x = (_Link_type)local_f0;
                local_f0._0_4_ = k;
                local_f0._4_4_ = uVar19;
                std::
                vector<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                ::push_back(&local_98,(value_type *)__x);
              }
              iVar20 = 0;
            }
          }
        }
      } while (((iVar20 == 5) || (iVar20 == 0)) &&
              (bVar22 = local_98.
                        super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        local_98.
                        super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                        ._M_impl.super__Vector_impl_data._M_finish, pSVar10 = local_70, bVar22));
    }
    std::
    _Rb_tree<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchState,_std::_Identity<(anonymous_namespace)::SearchState>,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
    ::_M_erase((_Rb_tree<(anonymous_namespace)::SearchState,_(anonymous_namespace)::SearchState,_std::_Identity<(anonymous_namespace)::SearchState>,_(anonymous_namespace)::SearchStateKeyCompare,_std::allocator<(anonymous_namespace)::SearchState>_>
                *)local_58._M_parent,__x);
    if (local_98.
        super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<(anonymous_namespace)::SearchState,_std::allocator<(anonymous_namespace)::SearchState>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar22;
}

Assistant:

bool S2Polyline::NearlyCovers(const S2Polyline& covered,
                              S1Angle max_error) const {
  // NOTE: This algorithm is described assuming that adjacent vertices in a
  // polyline are never at the same point.  That is, the ith and i+1th vertices
  // of a polyline are never at the same point in space.  The implementation
  // does not make this assumption.

  // DEFINITIONS:
  //   - edge "i" of a polyline is the edge from the ith to i+1th vertex.
  //   - covered_j is a polyline consisting of edges 0 through j of "covered."
  //   - this_i is a polyline consisting of edges 0 through i of this polyline.
  //
  // A search state is represented as an (int, int, bool) tuple, (i, j,
  // i_in_progress).  Using the "drive a car" analogy from the header comment, a
  // search state signifies that you can drive one car along "covered" from its
  // first vertex through a point on its jth edge, and another car along this
  // polyline from some point on or before its ith edge to a to a point on its
  // ith edge, such that no car ever goes backward, and the cars are always
  // within "max_error" of each other.  If i_in_progress is true, it means that
  // you can definitely drive along "covered" through the jth vertex (beginning
  // of the jth edge). Otherwise, you can definitely drive along "covered"
  // through the point on the jth edge of "covered" closest to the ith vertex of
  // this polyline.
  //
  // The algorithm begins by finding all edges of this polyline that are within
  // "max_error" of the first vertex of "covered," and adding search states
  // representing all of these possible starting states to the stack of
  // "pending" states.
  //
  // The algorithm proceeds by popping the next pending state,
  // (i,j,i_in_progress), off of the stack.  First it checks to see if that
  // state represents finding a valid covering of "covered" and returns true if
  // so.  Next, if the state represents reaching the end of this polyline
  // without finding a successful covering, the algorithm moves on to the next
  // state in the stack.  Otherwise, if state (i+1,j,false) is valid, it is
  // added to the stack of pending states.  Same for state (i,j+1,true).
  //
  // We need the stack because when "i" and "j" can both be incremented,
  // sometimes only one choice leads to a solution.  We use a set to keep track
  // of visited states to avoid duplicating work.  With the set, the worst-case
  // number of states examined is O(n+m) where n = this->num_vertices() and m =
  // covered.num_vertices().  Without it, the amount of work could be as high as
  // O((n*m)^2).  Using set, the running time is O((n*m) log (n*m)).
  //
  // TODO(user): Benchmark this, and see if the set is worth it.

  if (covered.num_vertices() == 0) return true;
  if (this->num_vertices() == 0) return false;

  vector<SearchState> pending;
  set<SearchState, SearchStateKeyCompare> done;

  // Find all possible starting states.
  for (int i = 0, next_i = NextDistinctVertex(*this, 0), next_next_i;
       next_i < this->num_vertices(); i = next_i, next_i = next_next_i) {
    next_next_i = NextDistinctVertex(*this, next_i);
    S2Point closest_point = S2::Project(
        covered.vertex(0), this->vertex(i), this->vertex(next_i));

    // In order to avoid duplicate starting states, we exclude the end vertex
    // of each edge *except* for the last non-degenerate edge.
    if ((next_next_i == this->num_vertices() ||
         closest_point != this->vertex(next_i)) &&
        S1Angle(closest_point, covered.vertex(0)) <= max_error) {
      pending.push_back(SearchState(i, 0, true));
    }
  }

  while (!pending.empty()) {
    const SearchState state = pending.back();
    pending.pop_back();
    if (!done.insert(state).second) continue;

    const int next_i = NextDistinctVertex(*this, state.i);
    const int next_j = NextDistinctVertex(covered, state.j);
    if (next_j == covered.num_vertices()) {
      return true;
    } else if (next_i == this->num_vertices()) {
      continue;
    }

    S2Point i_begin, j_begin;
    if (state.i_in_progress) {
      j_begin = covered.vertex(state.j);
      i_begin = S2::Project(
          j_begin, this->vertex(state.i), this->vertex(next_i));
    } else {
      i_begin = this->vertex(state.i);
      j_begin = S2::Project(
          i_begin, covered.vertex(state.j), covered.vertex(next_j));
    }

    if (S2::IsEdgeBNearEdgeA(j_begin, covered.vertex(next_j),
                             i_begin, this->vertex(next_i), max_error)) {
      pending.push_back(SearchState(next_i, state.j, false));
    }
    if (S2::IsEdgeBNearEdgeA(i_begin, this->vertex(next_i),
                             j_begin, covered.vertex(next_j), max_error)) {
      pending.push_back(SearchState(state.i, next_j, true));
    }
  }
  return false;
}